

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O0

void __thiscall Encode::Encode(Encode *this,List *list)

{
  bool bVar1;
  Node **ppNVar2;
  reference __x;
  char *j_4;
  iterator __end2_1;
  iterator __begin2_1;
  string *__range2_1;
  reference local_a8;
  char *j_3;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  int local_64;
  int local_60;
  int j_2;
  int j_1;
  int local_4c;
  string local_48 [4];
  int j;
  string tmpStr;
  int i;
  int listSize;
  Node **listIndexArr;
  List *list_local;
  Encode *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->m_probabilities);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->m_matrix);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_data);
  ppNVar2 = List::getIndexArray(list);
  tmpStr.field_2._12_4_ = List::getIndexArraySize(list);
  for (tmpStr.field_2._8_4_ = 0; (int)tmpStr.field_2._8_4_ < (int)tmpStr.field_2._12_4_;
      tmpStr.field_2._8_4_ = tmpStr.field_2._8_4_ + 1) {
    std::__cxx11::string::string(local_48);
    for (local_4c = 0; (ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).Digit[local_4c] != '\0';
        local_4c = local_4c + 1) {
      std::vector<char,_std::allocator<char>_>::push_back
                (&this->m_data,
                 (value_type *)((ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).Digit + local_4c));
    }
    local_60 = 0;
    while ((ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).Digit[(long)local_60 + 0xc] != '\0') {
      std::vector<char,_std::allocator<char>_>::push_back
                (&this->m_data,
                 (value_type *)
                 ((ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).Digit + (long)local_60 + 0xc));
      local_60 = local_60 + 1;
    }
    local_64 = 0;
    while ((ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).Digit[(long)local_64 + 0x2c] != '\0') {
      std::vector<char,_std::allocator<char>_>::push_back
                (&this->m_data,
                 (value_type *)
                 ((ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).Digit + (long)local_64 + 0x2c));
      local_64 = local_64 + 1;
    }
    std::__cxx11::to_string
              ((string *)&__range2,(int)(ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).data.year);
    std::__cxx11::string::operator=(local_48,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    __end2._M_current = (char *)std::__cxx11::string::begin();
    j_3 = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&j_3);
      if (!bVar1) break;
      local_a8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
      std::vector<char,_std::allocator<char>_>::push_back(&this->m_data,local_a8);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::to_string
              ((string *)&__range2_1,
               (int)(ppNVar2[(int)tmpStr.field_2._8_4_]->field_1).data.qtyPages);
    std::__cxx11::string::operator=(local_48,(string *)&__range2_1);
    std::__cxx11::string::~string((string *)&__range2_1);
    __end2_1._M_current = (char *)std::__cxx11::string::begin();
    j_4 = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&j_4);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end2_1);
      std::vector<char,_std::allocator<char>_>::push_back(&this->m_data,__x);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

explicit Encode(List &list) {
        Node **listIndexArr = list.getIndexArray();
        int listSize = list.getIndexArraySize();
        for (int i = 0; i < listSize; ++i) {
            string tmpStr;
            for (int j = 0; listIndexArr[i]->data.author[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.author[j]);
            }
            for (int j = 0; listIndexArr[i]->data.title[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.title[j]);
            }
            for (int j = 0; listIndexArr[i]->data.publishingHouse[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.publishingHouse[j]);
            }
            tmpStr = to_string(listIndexArr[i]->data.year);
            for (auto &j : tmpStr) {
                m_data.push_back(j);
            }
            tmpStr = to_string(listIndexArr[i]->data.qtyPages);
            for (auto &j : tmpStr) {
                m_data.push_back(j);
            }
        }
    }